

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kfpu.c
# Opt level: O1

floatx80 load_pack_float80(uint32 ea)

{
  byte bVar1;
  uint32 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  floatx80 fVar8;
  double tmp;
  char str [128];
  float64 local_a0;
  byte local_98;
  byte local_97 [18];
  byte local_85 [109];
  
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar2 = ea;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(ea);
  }
  uVar3 = m68k_read_memory_32(uVar2 & m68ki_cpu.address_mask);
  uVar4 = ea + 4;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  uVar5 = m68k_read_memory_32(uVar4 & m68ki_cpu.address_mask);
  uVar4 = ea + 8;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  uVar6 = m68k_read_memory_32(uVar4 & m68ki_cpu.address_mask);
  if ((int)uVar3 < 0) {
    pbVar7 = local_97;
    local_98 = 0x2d;
  }
  else {
    pbVar7 = &local_98;
  }
  *pbVar7 = (byte)uVar3 & 0xf | 0x30;
  pbVar7[1] = 0x2e;
  bVar1 = (byte)(uVar5 >> 0x18);
  pbVar7[2] = bVar1 >> 4 | 0x30;
  pbVar7[3] = bVar1 & 0xf | 0x30;
  pbVar7[4] = (byte)(uVar5 >> 0x14) & 0xf | 0x30;
  pbVar7[5] = (byte)(uVar5 >> 0x10) & 0xf | 0x30;
  pbVar7[6] = (byte)(uVar5 >> 0xc) & 0xf | 0x30;
  pbVar7[7] = (byte)(uVar5 >> 8) & 0xf | 0x30;
  pbVar7[8] = (byte)uVar5 >> 4 | 0x30;
  pbVar7[9] = (byte)uVar5 & 0xf | 0x30;
  bVar1 = (byte)(uVar6 >> 0x18);
  pbVar7[10] = bVar1 >> 4 | 0x30;
  pbVar7[0xb] = bVar1 & 0xf | 0x30;
  pbVar7[0xc] = (byte)(uVar6 >> 0x14) & 0xf | 0x30;
  pbVar7[0xd] = (byte)(uVar6 >> 0x10) & 0xf | 0x30;
  pbVar7[0xe] = (byte)(uVar6 >> 0xc) & 0xf | 0x30;
  pbVar7[0xf] = (byte)(uVar6 >> 8) & 0xf | 0x30;
  pbVar7[0x10] = (byte)uVar6 >> 4 | 0x30;
  pbVar7[0x11] = (byte)uVar6 & 0xf | 0x30;
  pbVar7[0x12] = 0x45;
  if ((uVar3 >> 0x1e & 1) == 0) {
    pbVar7 = pbVar7 + 0x13;
  }
  else {
    pbVar7[0x13] = 0x2d;
    pbVar7 = pbVar7 + 0x14;
  }
  *pbVar7 = (byte)(uVar3 >> 0x18) & 0xf | 0x30;
  pbVar7[1] = (byte)(uVar3 >> 0x14) & 0xf | 0x30;
  pbVar7[2] = (byte)(uVar3 >> 0x10) & 0xf | 0x30;
  pbVar7[3] = 0;
  __isoc99_sscanf(&local_98,"%le",&local_a0);
  fVar8 = float64_to_floatx80(local_a0);
  return fVar8;
}

Assistant:

static inline floatx80 load_pack_float80(uint32 ea)
{
	uint32 dw1, dw2, dw3;
	floatx80 result;
	double tmp;
	char str[128], *ch;

	dw1 = m68ki_read_32(ea);
	dw2 = m68ki_read_32(ea+4);
	dw3 = m68ki_read_32(ea+8);

	ch = &str[0];
	if (dw1 & 0x80000000)	// mantissa sign
	{
		*ch++ = '-';
	}
	*ch++ = (char)((dw1 & 0xf) + '0');
	*ch++ = '.';
	*ch++ = (char)(((dw2 >> 28) & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 24) & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 20) & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 16) & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 12) & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 8)  & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 4)  & 0xf) + '0');
	*ch++ = (char)(((dw2 >> 0)  & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 28) & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 24) & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 20) & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 16) & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 12) & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 8)  & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 4)  & 0xf) + '0');
	*ch++ = (char)(((dw3 >> 0)  & 0xf) + '0');
	*ch++ = 'E';
	if (dw1 & 0x40000000)	// exponent sign
	{
		*ch++ = '-';
	}
	*ch++ = (char)(((dw1 >> 24) & 0xf) + '0');
	*ch++ = (char)(((dw1 >> 20) & 0xf) + '0');
	*ch++ = (char)(((dw1 >> 16) & 0xf) + '0');
	*ch = '\0';

	sscanf(str, "%le", &tmp);

	result = double_to_fx80(tmp);

	return result;
}